

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void LogicalORExpression_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_70 [8];
  JsValue r5;
  JsValue r3;
  JsValue r1;
  JsAstBinaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r3.u + 8));
  JsGetValue((JsValue *)((long)&r3.u + 8),res);
  JsToBoolean(res,(JsValue *)((long)&r5.u + 8));
  if (r3.type != JS_NULL) {
    (*JsNodeClassEval[*(uint *)&(na[1].location)->filename])
              ((JsAstNode *)na[1].location,context,(JsValue *)local_70);
    JsGetValue((JsValue *)local_70,res);
  }
  return;
}

Assistant:

static void
LogicalORExpression_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r3, r5;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, res);
	JsToBoolean(res, &r3);
	if (r3.u.boolean == TRUE)
		return;
	EVAL(n->b, context, &r5);
	JsGetValue( &r5, res);
}